

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH_errorcode XXH3_64bits_reset_withSecret(XXH3_state_t *statePtr,void *secret,size_t secretSize)

{
  XXH_errorcode XVar1;
  
  XVar1 = XXH_ERROR;
  if (statePtr != (XXH3_state_t *)0x0) {
    XXH3_reset_internal(statePtr,0,secret,secretSize);
    if (secret != (void *)0x0) {
      XVar1 = (XXH_errorcode)(secretSize < 0x88);
    }
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH3_64bits_reset_withSecret(XXH3_state_t* statePtr, const void* secret, size_t secretSize)
{
    if (statePtr == NULL) return XXH_ERROR;
    XXH3_reset_internal(statePtr, 0, secret, secretSize);
    if (secret == NULL) return XXH_ERROR;
    if (secretSize < XXH3_SECRET_SIZE_MIN) return XXH_ERROR;
    return XXH_OK;
}